

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::saveProgramOptionsHash(CLIntercept *this,cl_program program,char *options)

{
  size_t length;
  uint64_t uVar1;
  mapped_type *pmVar2;
  CLIntercept *this_00;
  cl_program local_28;
  
  local_28 = program;
  std::mutex::lock(&this->m_Mutex);
  if (options != (char *)0x0 && program != (cl_program)0x0) {
    this_00 = (CLIntercept *)options;
    length = strlen(options);
    uVar1 = computeHash(this_00,options,length);
    pmVar2 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,&local_28);
    pmVar2->OptionsHash = uVar1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::saveProgramOptionsHash(
    const cl_program program,
    const char* options )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( program != NULL && options != NULL )
    {
        uint64_t hash = computeHash(
            options,
            strlen( options ) );

        m_ProgramInfoMap[ program ].OptionsHash = hash;
    }
}